

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

Belief * __thiscall
despot::BaseRockSample::Tau(BaseRockSample *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  double dVar1;
  value_type pSVar2;
  int iVar3;
  int iVar4;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar5;
  const_reference ppSVar6;
  const_reference ppRVar7;
  reference pvVar8;
  void *this_01;
  ParticleBelief *pPVar9;
  double dVar10;
  pointer ppSVar11;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  value_type local_a0;
  State *new_particle;
  undefined1 local_90 [4];
  int i_1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  double p;
  RockSampleState *next;
  int id;
  RockSampleState *state;
  State *particle;
  double dStack_48;
  int i;
  double sum;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  OBS_TYPE local_28;
  OBS_TYPE obs_local;
  Belief *pBStack_18;
  ACT_TYPE action_local;
  Belief *belief_local;
  BaseRockSample *this_local;
  
  local_28 = obs;
  obs_local._4_4_ = action;
  pBStack_18 = belief;
  belief_local = (Belief *)this;
  if ((Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs), iVar3 != 0)
     ) {
    iVar3 = (**(code **)(*(long *)this + 0x10))();
    std::allocator<double>::allocator((allocator<double> *)((long)&particles + 3));
    std::vector<double,_std::allocator<double>_>::vector
              (&Tau::probs,(long)iVar3,(allocator<double> *)((long)&particles + 3));
    std::allocator<double>::~allocator((allocator<double> *)((long)&particles + 3));
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
    __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
  }
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)pBStack_18 + 0x30))();
  dStack_48 = 0.0;
  for (particle._4_4_ = 0;
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00),
      (ulong)(long)particle._4_4_ < sVar5; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)particle._4_4_);
    pSVar2 = *ppSVar6;
    iVar3 = NextState(this,*(int *)(pSVar2 + 0xc),obs_local._4_4_);
    iVar4 = (**(code **)(*(long *)this + 0x10))();
    if (iVar3 != iVar4 + -1) {
      ppRVar7 = std::vector<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>::
                operator[](&this->states_,(long)iVar3);
      dVar1 = *(double *)(pSVar2 + 0x18);
      dVar10 = (double)(**(code **)(*(long *)this + 0x48))(this,local_28,*ppRVar7,obs_local._4_4_);
      ppSVar11 = (pointer)(dVar1 * dVar10);
      new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppSVar11;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&Tau::probs,(long)iVar3);
      *pvVar8 = (double)ppSVar11 + *pvVar8;
      dStack_48 = (double)new_particles.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + dStack_48;
    }
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
  for (new_particle._4_4_ = 0; iVar3 = new_particle._4_4_,
      iVar4 = (**(code **)(*(long *)this + 0x10))(), iVar3 < iVar4;
      new_particle._4_4_ = new_particle._4_4_ + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&Tau::probs,(long)new_particle._4_4_);
    if (0.0 < *pvVar8) {
      ppRVar7 = std::vector<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>::
                operator[](&this->states_,(long)new_particle._4_4_);
      local_a0 = (value_type)(**(code **)(*(long *)this + 0xc0))(this,*ppRVar7);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&Tau::probs,(long)new_particle._4_4_);
      *(double *)(local_a0 + 0x18) = *pvVar8 / dStack_48;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90,&local_a0);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&Tau::probs,(long)new_particle._4_4_);
      *pvVar8 = 0.0;
    }
  }
  sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                    ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
  if (sVar5 != 0) {
    pPVar9 = (ParticleBelief *)operator_new(0x90);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              (&local_b8,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
    despot::ParticleBelief::ParticleBelief(pPVar9,&local_b8,&this->super_BeliefMDP,0);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_b8);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
    return (Belief *)pPVar9;
  }
  this_01 = (void *)despot::operator<<((ostream *)&std::cout,pBStack_18);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

Belief* BaseRockSample::Tau(const Belief* belief, ACT_TYPE action,
	OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		RockSampleState* state = static_cast<RockSampleState*>(particle);
		int id = NextState(state->state_id, action);

		if (id == NumStates() - 1)
			continue; // ignore terminal state

		const RockSampleState& next = *(states_[id]);
		double p = state->weight * ObsProb(obs, next, action);
		probs[id] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			State* new_particle = Copy(states_[i]);
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	if (new_particles.size() == 0) {
		cout << *belief << endl;
		exit(0);
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}